

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall Clasp::SatPreprocessor::discardClauses(SatPreprocessor *this,bool full)

{
  Clause *pCVar1;
  Clause *pCVar2;
  size_type i;
  uint uVar3;
  ebo local_28;
  
  for (uVar3 = 0; uVar3 != (this->clauses_).ebo_.size; uVar3 = uVar3 + 1) {
    pCVar2 = (this->clauses_).ebo_.buf[uVar3];
    if (pCVar2 != (Clause *)0x0) {
      operator_delete(pCVar2);
    }
  }
  local_28.buf = (this->clauses_).ebo_.buf;
  (this->clauses_).ebo_.buf = (pointer)0x0;
  (this->clauses_).ebo_.size = 0;
  local_28.cap = (this->clauses_).ebo_.cap;
  (this->clauses_).ebo_.cap = 0;
  local_28.size = uVar3;
  bk_lib::
  pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>::
  ebo::~ebo(&local_28);
  pCVar2 = this->elimTop_;
  if (this->elimTop_ != (Clause *)0x0 && full) {
    do {
      pCVar1 = (pCVar2->data_).next;
      operator_delete(pCVar2);
      pCVar2 = pCVar1;
    } while (pCVar1 != (Clause *)0x0);
    this->elimTop_ = (Clause *)0x0;
  }
  if (full) {
    (this->seen_).lo = 1;
    (this->seen_).hi = 1;
  }
  return;
}

Assistant:

void SatPreprocessor::discardClauses(bool full) {
	for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
		if (clauses_[i]) { clauses_[i]->destroy(); }
	}
	ClauseList().swap(clauses_);
	if (Clause* r = (full ? elimTop_ : 0)) {
		do {
			Clause* t = r;
			 r = r->next();
			 t->destroy();
		} while (r);
		elimTop_ = 0;
	}
	if (full) { seen_ = Range32(1,1); }
}